

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool tinyobj::LoadObj(attrib_t *attrib,
                     vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *shapes,
                     vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
                     string *warn,string *err,char *filename,char *mtl_basedir,bool trianglulate,
                     bool default_vcols_fallback)

{
  pointer pfVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  long local_410;
  ifstream ifs;
  byte abStack_3f0 [488];
  stringstream local_208 [8];
  stringstream errss;
  ostream local_1f8 [376];
  undefined1 local_80 [8];
  MaterialFileReader matFileReader;
  string baseDir;
  
  pfVar1 = (attrib->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((attrib->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (attrib->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1;
  }
  pfVar1 = (attrib->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((attrib->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (attrib->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1;
  }
  pfVar1 = (attrib->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((attrib->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (attrib->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1;
  }
  pfVar1 = (attrib->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((attrib->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (attrib->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1;
  }
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::clear(shapes);
  std::__cxx11::stringstream::stringstream(local_208);
  std::ifstream::ifstream(&local_410,filename,_S_in);
  if ((abStack_3f0[*(long *)(local_410 + -0x18)] & 5) == 0) {
    pcVar4 = "";
    if (mtl_basedir != (char *)0x0) {
      pcVar4 = mtl_basedir;
    }
    std::__cxx11::string::string
              ((string *)(matFileReader.m_mtlBaseDir.field_2._M_local_buf + 8),pcVar4,
               (allocator *)local_80);
    if ((baseDir._M_dataplus._M_p != (pointer)0x0) &&
       (baseDir._M_dataplus._M_p[matFileReader.m_mtlBaseDir.field_2._8_8_ + -1] != '/')) {
      std::__cxx11::string::push_back((char)&matFileReader + ' ');
    }
    MaterialFileReader::MaterialFileReader
              ((MaterialFileReader *)local_80,
               (string *)((long)&matFileReader.m_mtlBaseDir.field_2 + 8));
    bVar2 = LoadObj(attrib,shapes,materials,warn,err,(istream *)&local_410,
                    (MaterialReader *)local_80,trianglulate,default_vcols_fallback);
    MaterialFileReader::~MaterialFileReader((MaterialFileReader *)local_80);
    std::__cxx11::string::~string((string *)(matFileReader.m_mtlBaseDir.field_2._M_local_buf + 8));
  }
  else {
    poVar3 = std::operator<<(local_1f8,"Cannot open file [");
    poVar3 = std::operator<<(poVar3,filename);
    poVar3 = std::operator<<(poVar3,"]");
    std::endl<char,std::char_traits<char>>(poVar3);
    if (err != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)err,(string *)local_80);
      std::__cxx11::string::~string((string *)local_80);
    }
    bVar2 = false;
  }
  std::ifstream::~ifstream(&local_410);
  std::__cxx11::stringstream::~stringstream(local_208);
  return bVar2;
}

Assistant:

bool LoadObj(attrib_t *attrib, std::vector<shape_t> *shapes,
             std::vector<material_t> *materials, std::string *warn,
             std::string *err, const char *filename, const char *mtl_basedir,
             bool trianglulate, bool default_vcols_fallback) {
  attrib->vertices.clear();
  attrib->normals.clear();
  attrib->texcoords.clear();
  attrib->colors.clear();
  shapes->clear();

  std::stringstream errss;

  std::ifstream ifs(filename);
  if (!ifs) {
    errss << "Cannot open file [" << filename << "]" << std::endl;
    if (err) {
      (*err) = errss.str();
    }
    return false;
  }

  std::string baseDir = mtl_basedir ? mtl_basedir : "";
  if (!baseDir.empty()) {
#ifndef _WIN32
    const char dirsep = '/';
#else
    const char dirsep = '\\';
#endif
    if (baseDir[baseDir.length() - 1] != dirsep) baseDir += dirsep;
  }
  MaterialFileReader matFileReader(baseDir);

  return LoadObj(attrib, shapes, materials, warn, err, &ifs, &matFileReader,
                 trianglulate, default_vcols_fallback);
}